

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_open_uri.cxx
# Opt level: O0

void fl_decode_uri(char *uri)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_1c [4];
  char *pcStack_18;
  int h;
  char *last;
  char *uri_local;
  
  last = uri;
  sVar2 = strlen(uri);
  pcStack_18 = uri + sVar2;
  do {
    if (pcStack_18 + -2 <= last) {
      return;
    }
    if (*last == '%') {
      iVar1 = __isoc99_sscanf(last + 1,"%2X",local_1c);
      if (iVar1 != 1) {
        return;
      }
      *last = local_1c[0];
      memmove(last + 1,last + 3,(long)pcStack_18 - (long)(last + 2));
      pcStack_18 = pcStack_18 + -2;
    }
    last = last + 1;
  } while( true );
}

Assistant:

void fl_decode_uri(char *uri)
{
  char *last = uri + strlen(uri);
  while (uri < last-2) {
    if (*uri == '%') {
      int h;
      if ( sscanf(uri+1, "%2X", &h) != 1 ) break;
      *uri = h;
      memmove(uri+1, uri+3, last - (uri+2));
      last -= 2;
    }
    uri++;
  }
}